

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O0

bool __thiscall
cmBuildNameCommand::InitialPass
          (cmBuildNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  RegularExpression *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  const_reference pvVar3;
  char *pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  ulong uVar5;
  char local_3fa [2];
  char *local_3f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  char local_3e2 [2];
  char *local_3e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  char local_3ca [2];
  char *local_3c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  string local_3b8;
  allocator local_391;
  undefined1 local_390 [8];
  string compiler;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 local_2f0 [8];
  RegularExpression reg_1;
  string local_218 [8];
  string RegExp;
  string local_1f0;
  allocator local_1c9;
  undefined1 local_1c8 [8];
  string buildname;
  char local_18a [2];
  char *local_188;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  char local_172 [2];
  char *local_170;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  allocator local_159;
  string local_158 [8];
  string cv;
  RegularExpression reg;
  char *cacheValue;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmBuildNameCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,pvVar3);
    if (pcVar4 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_1c8,"WinNT",&local_1c9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1f0,"UNIX",(allocator *)(RegExp.field_2._M_local_buf + 0xf));
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)(RegExp.field_2._M_local_buf + 0xf));
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)local_1c8,"");
        cmSystemTools::RunSingleCommand
                  ("uname -a",(string *)local_1c8,(string *)local_1c8,(int *)0x0,(char *)0x0,
                   OUTPUT_MERGE,0.0);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_218,"([^ ]*) [^ ]* ([^ ]*) ",(allocator *)((long)&reg_1.searchstring + 7)
                    );
          std::allocator<char>::~allocator((allocator<char> *)((long)&reg_1.searchstring + 7));
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmsys::RegularExpression::RegularExpression((RegularExpression *)local_2f0,pcVar4);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmsys::RegularExpression::find((RegularExpression *)local_2f0,pcVar4);
          if (bVar2) {
            cmsys::RegularExpression::match_abi_cxx11_(&local_350,(RegularExpression *)local_2f0,1);
            std::operator+(&local_330,&local_350,"-");
            cmsys::RegularExpression::match_abi_cxx11_
                      ((string *)((long)&compiler.field_2 + 8),(RegularExpression *)local_2f0,2);
            std::operator+(&local_310,&local_330,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&compiler.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_1c8,(string *)&local_310);
            std::__cxx11::string::~string((string *)&local_310);
            std::__cxx11::string::~string((string *)(compiler.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)&local_330);
            std::__cxx11::string::~string((string *)&local_350);
          }
          cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_2f0);
          std::__cxx11::string::~string(local_218);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_390,"${CMAKE_CXX_COMPILER}",&local_391);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      cmMakefile::ExpandVariablesInString((this->super_cmCommand).Makefile,(string *)local_390);
      std::__cxx11::string::operator+=((string *)local_1c8,"-");
      cmsys::SystemTools::GetFilenameName(&local_3b8,(string *)local_390);
      std::__cxx11::string::operator+=((string *)local_1c8,(string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      local_3c0._M_current = (char *)std::__cxx11::string::begin();
      local_3c8 = (char *)std::__cxx11::string::end();
      local_3ca[1] = 0x2f;
      local_3ca[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_3c0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_3c8,local_3ca + 1,local_3ca);
      local_3d8._M_current = (char *)std::__cxx11::string::begin();
      local_3e0 = (char *)std::__cxx11::string::end();
      local_3e2[1] = 0x28;
      local_3e2[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_3d8,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_3e0,local_3e2 + 1,local_3e2);
      local_3f0._M_current = (char *)std::__cxx11::string::begin();
      local_3f8 = (char *)std::__cxx11::string::end();
      local_3fa[1] = 0x29;
      local_3fa[0] = '_';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (local_3f0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_3f8,local_3fa + 1,local_3fa);
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition(pcVar1,pvVar3,pcVar4,"Name of build.",STRING,false);
      this_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_390);
      std::__cxx11::string::~string((string *)local_1c8);
    }
    else {
      this_00 = (RegularExpression *)((long)&cv.field_2 + 8);
      cmsys::RegularExpression::RegularExpression(this_00,"[()/]");
      bVar2 = cmsys::RegularExpression::find(this_00,pcVar4);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,pcVar4,&local_159);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        local_168._M_current = (char *)std::__cxx11::string::begin();
        local_170 = (char *)std::__cxx11::string::end();
        local_172[1] = 0x2f;
        local_172[0] = '_';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_168,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_170,local_172 + 1,local_172);
        local_180._M_current = (char *)std::__cxx11::string::begin();
        local_188 = (char *)std::__cxx11::string::end();
        local_18a[1] = 0x28;
        local_18a[0] = '_';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_180,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_188,local_18a + 1,local_18a);
        __first._M_current = (char *)std::__cxx11::string::begin();
        __last._M_current = (char *)std::__cxx11::string::end();
        buildname.field_2._M_local_buf[0xf] = ')';
        buildname.field_2._M_local_buf[0xe] = '_';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (__first,__last,buildname.field_2._M_local_buf + 0xf,
                   buildname.field_2._M_local_buf + 0xe);
        pcVar1 = (this->super_cmCommand).Makefile;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,0);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddCacheDefinition(pcVar1,pvVar3,pcVar4,"Name of build.",STRING,false);
        std::__cxx11::string::~string(local_158);
      }
      this_local._7_1_ = 1;
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&cv.field_2 + 8));
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBuildNameCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  const char* cacheValue = this->Makefile->GetDefinition(args[0]);
  if (cacheValue) {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    if (reg.find(cacheValue)) {
      std::string cv = cacheValue;
      std::replace(cv.begin(), cv.end(), '/', '_');
      std::replace(cv.begin(), cv.end(), '(', '_');
      std::replace(cv.begin(), cv.end(), ')', '_');
      this->Makefile->AddCacheDefinition(args[0], cv.c_str(), "Name of build.",
                                         cmStateEnums::STRING);
    }
    return true;
  }

  std::string buildname = "WinNT";
  if (this->Makefile->GetDefinition("UNIX")) {
    buildname = "";
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if (!buildname.empty()) {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg(RegExp.c_str());
      if (reg.find(buildname.c_str())) {
        buildname = reg.match(1) + "-" + reg.match(2);
      }
    }
  }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  this->Makefile->ExpandVariablesInString(compiler);
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  std::replace(buildname.begin(), buildname.end(), '/', '_');
  std::replace(buildname.begin(), buildname.end(), '(', '_');
  std::replace(buildname.begin(), buildname.end(), ')', '_');

  this->Makefile->AddCacheDefinition(args[0], buildname.c_str(),
                                     "Name of build.", cmStateEnums::STRING);
  return true;
}